

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_uint * nk_find_value(nk_window *win,nk_hash name)

{
  nk_uint *pnVar1;
  nk_hash *pnVar2;
  nk_table *pnVar3;
  nk_table **ppnVar4;
  ulong uVar5;
  nk_hash *pnVar6;
  bool bVar7;
  
  ppnVar4 = &win->tables;
  do {
    pnVar3 = *ppnVar4;
    if (pnVar3 == (nk_table *)0x0) {
      return (nk_uint *)0x0;
    }
    uVar5 = (ulong)pnVar3->size;
    pnVar6 = pnVar3->keys + 0x3a;
    while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
      pnVar1 = pnVar6 + 1;
      pnVar2 = pnVar6 + -0x3a;
      pnVar6 = pnVar1;
      if (*pnVar2 == name) {
        pnVar3->seq = win->seq;
        return pnVar1;
      }
    }
    ppnVar4 = &pnVar3->next;
  } while( true );
}

Assistant:

NK_LIB nk_uint*
nk_find_value(struct nk_window *win, nk_hash name)
{
    struct nk_table *iter = win->tables;
    while (iter) {
        unsigned int i = 0;
        unsigned int size = iter->size;
        for (i = 0; i < size; ++i) {
            if (iter->keys[i] == name) {
                iter->seq = win->seq;
                return &iter->values[i];
            }
        } size = NK_VALUE_PAGE_CAPACITY;
        iter = iter->next;
    }
    return 0;
}